

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.cpp
# Opt level: O2

string * __thiscall
duckdb::KeyValueSecret::ToString_abi_cxx11_
          (string *__return_storage_ptr__,KeyValueSecret *this,SecretDisplayType mode)

{
  _Rb_tree_header *p_Var1;
  pointer pbVar2;
  const_iterator cVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  undefined7 in_register_00000011;
  char *__rhs;
  _Self __tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *scope_it;
  pointer __lhs;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined4 local_5c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  local_5c = (undefined4)CONCAT71(in_register_00000011,mode);
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::operator+(&local_80,"name=",&(this->super_BaseSecret).name);
  ::std::operator+(&local_a0,&local_80,";");
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::operator+(&local_80,"type=",&(this->super_BaseSecret).type);
  ::std::operator+(&local_a0,&local_80,";");
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::operator+(&local_80,"provider=",&(this->super_BaseSecret).provider);
  ::std::operator+(&local_a0,&local_80,";");
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::string((string *)&local_50,"serializable=",&local_a1);
  __rhs = "false";
  if ((this->super_BaseSecret).serializable != false) {
    __rhs = "true";
  }
  ::std::operator+(&local_80,&local_50,__rhs);
  ::std::operator+(&local_a0,&local_80,";");
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  pbVar2 = (this->super_BaseSecret).prefix_paths.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__lhs = (this->super_BaseSecret).prefix_paths.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar2; __lhs = __lhs + 1) {
    ::std::operator+(&local_a0,__lhs,",");
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_a0);
  }
  ::std::__cxx11::string::substr((ulong)&local_a0,(ulong)__return_storage_ptr__);
  ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  p_Var5 = (this->secret_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->secret_map)._M_t._M_impl.super__Rb_tree_header;
  local_58 = &(this->redact_keys)._M_h;
  do {
    if ((_Rb_tree_header *)p_Var5 == p_Var1) {
      return __return_storage_ptr__;
    }
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((char)local_5c == '\0') {
      cVar3 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(local_58,(key_type *)(p_Var5 + 1));
      if (cVar3.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) goto LAB_0199e6c6;
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
LAB_0199e6c6:
      Value::ToString_abi_cxx11_(&local_a0,(Value *)(p_Var5 + 2));
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_a0);
    }
    p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_decrement(&p_Var1->_M_header);
    if (p_Var5 != p_Var4) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    p_Var5 = (_Base_ptr)::std::_Rb_tree_increment(p_Var5);
  } while( true );
}

Assistant:

string KeyValueSecret::ToString(SecretDisplayType mode) const {
	string result;

	result += "name=" + name + ";";
	result += "type=" + type + ";";
	result += "provider=" + provider + ";";
	result += string("serializable=") + (serializable ? "true" : "false") + ";";
	result += "scope=";
	for (const auto &scope_it : prefix_paths) {
		result += scope_it + ",";
	}
	result = result.substr(0, result.size() - 1);
	result += ";";
	for (auto it = secret_map.begin(); it != secret_map.end(); it++) {
		result.append(it->first);
		result.append("=");
		if (mode == SecretDisplayType::REDACTED && redact_keys.find(it->first) != redact_keys.end()) {
			result.append("redacted");
		} else {
			result.append(it->second.ToString());
		}
		if (it != --secret_map.end()) {
			result.append(";");
		}
	}

	return result;
}